

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O3

void av1_calculate_tile_rows(SequenceHeader *seq_params,int cm_mi_rows,CommonTileParams *tiles)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  
  bVar1 = (byte)seq_params->mib_size_log2;
  iVar2 = (1 << (bVar1 & 0x1f)) + cm_mi_rows + -1 >> (bVar1 & 0x1f);
  if (tiles->uniform_spacing != 0) {
    bVar1 = (byte)tiles->log2_rows;
    iVar4 = (1 << (bVar1 & 0x1f)) + iVar2 + -1 >> (bVar1 & 0x1f);
    uVar3 = 0;
    if (0 < iVar2) {
      iVar5 = 0;
      do {
        tiles->row_start_sb[uVar3] = iVar5;
        iVar5 = iVar5 + iVar4;
        uVar3 = uVar3 + 1;
      } while (iVar5 < iVar2);
    }
    tiles->rows = (int)uVar3;
    tiles->row_start_sb[uVar3 & 0xffffffff] = iVar2;
    iVar4 = iVar4 << ((byte)seq_params->mib_size_log2 & 0x1f);
    if (cm_mi_rows <= iVar4) {
      iVar4 = cm_mi_rows;
    }
    tiles->height = iVar4;
    return;
  }
  iVar2 = -1;
  do {
    iVar2 = iVar2 + 1;
  } while (1 << ((byte)iVar2 & 0x1f) < tiles->rows);
  tiles->log2_rows = iVar2;
  return;
}

Assistant:

void av1_calculate_tile_rows(const SequenceHeader *const seq_params,
                             int cm_mi_rows, CommonTileParams *const tiles) {
  int sb_rows = CEIL_POWER_OF_TWO(cm_mi_rows, seq_params->mib_size_log2);
  int start_sb, size_sb, i;

  if (tiles->uniform_spacing) {
    size_sb = CEIL_POWER_OF_TWO(sb_rows, tiles->log2_rows);
    assert(size_sb > 0);
    for (i = 0, start_sb = 0; start_sb < sb_rows; i++) {
      tiles->row_start_sb[i] = start_sb;
      start_sb += size_sb;
    }
    tiles->rows = i;
    tiles->row_start_sb[i] = sb_rows;

    tiles->height = size_sb << seq_params->mib_size_log2;
    tiles->height = AOMMIN(tiles->height, cm_mi_rows);
  } else {
    tiles->log2_rows = tile_log2(1, tiles->rows);
  }
}